

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

bool __thiscall Table::in_delimiter(Table *this,string *key)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Rb_tree_header *p_Var2;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  string *local_20;
  
  __it._M_node = (this->delimiters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->delimiters)._M_t._M_impl.super__Rb_tree_header;
  _Var3._M_node = __it._M_node;
  if ((_Rb_tree_header *)__it._M_node != p_Var2) {
    local_20 = key;
    do {
      bVar1 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                        ((_Iter_equals_val<std::__cxx11::string_const> *)&local_20,__it);
      _Var3._M_node = __it._M_node;
      if (bVar1) break;
      __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
      _Var3._M_node = &p_Var2->_M_header;
    } while ((_Rb_tree_header *)__it._M_node != p_Var2);
  }
  return (_Rb_tree_header *)_Var3._M_node != p_Var2;
}

Assistant:

bool Table::in_delimiter(const std::string &key) {
    return std::find(delimiters.begin(), delimiters.end(), key) != delimiters.end();
}